

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O2

void __thiscall
wasm::WATParser::ParseTypeDefsCtx::addStructType(ParseTypeDefsCtx *this,StructT *type)

{
  pointer pNVar1;
  char *pcVar2;
  size_t sVar3;
  uint uVar4;
  mapped_type *pmVar5;
  ulong uVar6;
  Entry local_40;
  
  local_40.builder = this->builder;
  local_40.index = (size_t)this->index;
  TypeBuilder::Entry::operator=(&local_40,&type->second);
  uVar4 = 0;
  while( true ) {
    local_40.builder = (TypeBuilder *)CONCAT44(local_40.builder._4_4_,uVar4);
    uVar6 = (ulong)uVar4;
    pNVar1 = (type->first).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(type->first).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)pNVar1 >> 4) <= uVar6)
    break;
    pcVar2 = *(char **)((long)&pNVar1[uVar6].super_IString.str + 8);
    if (pcVar2 != (char *)0x0) {
      sVar3 = pNVar1[uVar6].super_IString.str._M_len;
      pmVar5 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&(this->names).
                                super__Vector_base<wasm::TypeNames,_std::allocator<wasm::TypeNames>_>
                                ._M_impl.super__Vector_impl_data._M_start[this->index].fieldNames,
                            (key_type *)&local_40);
      (pmVar5->super_IString).str._M_len = sVar3;
      (pmVar5->super_IString).str._M_str = pcVar2;
      uVar4 = (uint)local_40.builder;
    }
    uVar4 = uVar4 + 1;
  }
  return;
}

Assistant:

void addStructType(StructT& type) {
    auto& [fieldNames, str] = type;
    builder[index] = str;
    for (Index i = 0; i < fieldNames.size(); ++i) {
      if (auto name = fieldNames[i]; name.is()) {
        names[index].fieldNames[i] = name;
      }
    }
  }